

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceSpot::IfcLightSourceSpot(IfcLightSourceSpot *this)

{
  *(undefined ***)&this->field_0xf0 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0xf8 = 0;
  *(char **)&this->field_0x100 = "IfcLightSourceSpot";
  IfcLightSourcePositional::IfcLightSourcePositional
            (&this->super_IfcLightSourcePositional,&PTR_construction_vtable_24__007b7c08);
  *(undefined8 *)&(this->super_IfcLightSourcePositional).field_0xc0 = 0;
  *(undefined8 *)&(this->super_IfcLightSourcePositional).field_0xc8 = 0;
  (this->super_IfcLightSourcePositional).super_IfcLightSource.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7b7b28;
  *(undefined8 *)&this->field_0xf0 = 0x7b7bf0;
  *(undefined8 *)
   &(this->super_IfcLightSourcePositional).super_IfcLightSource.super_IfcGeometricRepresentationItem
    .super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7b7b50;
  *(undefined8 *)
   &(this->super_IfcLightSourcePositional).super_IfcLightSource.super_IfcGeometricRepresentationItem
    .super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7b7b78;
  *(undefined8 *)&(this->super_IfcLightSourcePositional).super_IfcLightSource.field_0x80 = 0x7b7ba0;
  *(undefined8 *)&(this->super_IfcLightSourcePositional).field_0xb8 = 0x7b7bc8;
  (this->ConcentrationExponent).have = false;
  return;
}

Assistant:

IfcLightSourceSpot() : Object("IfcLightSourceSpot") {}